

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void ReadRegTestArgs(ArgsManager *args,RegTestOptions *options)

{
  long lVar1;
  int32_t iVar2;
  int64_t iVar3;
  bool bVar4;
  optional<bool> oVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  undefined8 in_R8;
  int j;
  long lVar11;
  VBDeploymentInfo *pVVar12;
  _Alloc_hider _Var13;
  long in_FS_OFFSET;
  string_view str;
  string_view name;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view logging_function;
  string_view str_03;
  string_view source_file;
  optional<Consensus::BuriedDeployment> buried_deployment;
  int32_t height;
  VersionBitsParameters vbparams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vDeploymentParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> deployment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"-fastprune",(allocator<char> *)&deployment_name);
  oVar5 = ArgsManager::GetBoolArg(args,&value);
  std::__cxx11::string::~string((string *)&value);
  if (((ushort)oVar5.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->fastprune =
         oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"-testactivationheight",(allocator<char> *)&deployment_name);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&vbparams,args,&value);
  std::__cxx11::string::~string((string *)&value);
  iVar3 = vbparams.timeout;
  for (pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vbparams.start_time;
      pbVar10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3;
      pbVar10 = pbVar10 + 1) {
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (pbVar10,'@',0);
    if (args_00 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                (&value,(tinyformat *)"Invalid format (%s) for -testactivationheight=name@height.",
                 (char *)pbVar10,in_RCX);
      std::runtime_error::runtime_error(prVar8,(string *)&value);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001244ff;
    }
    uVar9 = 0xffffffffffffffff;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&value,pbVar10,(size_type)((long)&(args_00->_M_dataplus)._M_p + 1),0xffffffffffffffff
              );
    str._M_str._2_6_ = value._M_dataplus._M_p._2_6_;
    str._M_str._0_2_ = value._M_dataplus._M_p._0_2_;
    str._M_len = value._M_string_length;
    bVar4 = ParseInt32(str,&height);
    args_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)uVar9 >> 8),(uint)height < 0x7fffffff);
    if (!bVar4 || (uint)height >= 0x7fffffff) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                (&deployment_name,
                 (tinyformat *)"Invalid height value (%s) for -testactivationheight=name@height.",
                 (char *)pbVar10,args_01);
      std::runtime_error::runtime_error(prVar8,(string *)&deployment_name);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001244ff;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&deployment_name,pbVar10,0,(size_type)args_00);
    name._M_str = deployment_name._M_dataplus._M_p;
    name._M_len = deployment_name._M_string_length;
    buried_deployment = GetBuriedDeployment(name);
    iVar2 = height;
    if (((uint)buried_deployment.super__Optional_base<Consensus::BuriedDeployment,_true,_true>.
               _M_payload.super__Optional_payload_base<Consensus::BuriedDeployment> >> 0x10 & 1) ==
        0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                ((string *)&vDeploymentParams,
                 (tinyformat *)"Invalid name (%s) for -testactivationheight=name@height.",
                 (char *)pbVar10,args_00);
      std::runtime_error::runtime_error(prVar8,(string *)&vDeploymentParams);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001244ff;
    }
    pmVar6 = std::__detail::
             _Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&options->activation_heights,(key_type *)&buried_deployment);
    *pmVar6 = iVar2;
    std::__cxx11::string::~string((string *)&deployment_name);
    std::__cxx11::string::~string((string *)&value);
    in_RCX = args_00;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vbparams);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"-vbparams",(allocator<char> *)&deployment_name);
  bVar4 = ArgsManager::IsArgSet(args,&value);
  std::__cxx11::string::~string((string *)&value);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"-vbparams",(allocator<char> *)&vDeploymentParams);
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&deployment_name,args,&value);
    std::__cxx11::string::~string((string *)&value);
    for (_Var13 = deployment_name._M_dataplus;
        _Var13._M_p != (pointer)deployment_name._M_string_length; _Var13._M_p = _Var13._M_p + 0x20)
    {
      str_03._M_str = (char *)0x3a;
      str_03._M_len = *(size_t *)_Var13._M_p;
      util::SplitString_abi_cxx11_
                (&vDeploymentParams,*(util **)((long)_Var13._M_p + 8),str_03,(char)in_R8);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (((long)vDeploymentParams.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vDeploymentParams.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 5);
      if (pbVar10 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0xfffffffffffffffe) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar8,
                   "Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001244ff;
      }
      vbparams.min_activation_height = 0;
      vbparams._20_4_ = 0;
      vbparams.start_time = 0;
      vbparams.timeout = 0;
      str_00._M_str =
           vDeploymentParams.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      str_00._M_len =
           vDeploymentParams.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
      bVar4 = ParseInt64(str_00,&vbparams.start_time);
      if (!bVar4) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&value,(tinyformat *)"Invalid nStartTime (%s)",
                   (char *)(vDeploymentParams.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1),pbVar10);
        std::runtime_error::runtime_error(prVar8,(string *)&value);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001244ff;
      }
      str_01._M_str =
           vDeploymentParams.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      str_01._M_len =
           vDeploymentParams.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length;
      bVar4 = ParseInt64(str_01,&vbparams.timeout);
      if (!bVar4) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&value,(tinyformat *)"Invalid nTimeout (%s)",
                   (char *)(vDeploymentParams.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2),pbVar10);
        std::runtime_error::runtime_error(prVar8,(string *)&value);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001244ff;
      }
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)vDeploymentParams.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vDeploymentParams.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      if (pbVar10 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x61) {
        vbparams._16_8_ = vbparams._16_8_ & 0xffffffff00000000;
      }
      else {
        str_02._M_str =
             vDeploymentParams.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
        str_02._M_len =
             vDeploymentParams.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length;
        bVar4 = ParseInt32(str_02,&vbparams.min_activation_height);
        if (!bVar4) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&value,(tinyformat *)"Invalid min_activation_height (%s)",
                     (char *)(vDeploymentParams.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 3),pbVar10);
          std::runtime_error::runtime_error(prVar8,(string *)&value);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_001244ff;
        }
      }
      pVVar12 = VersionBitsDeploymentInfo;
      lVar11 = 0;
      while( true ) {
        if (lVar11 == 2) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&value,(tinyformat *)"Invalid deployment (%s)",
                     (char *)vDeploymentParams.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,pbVar10);
          std::runtime_error::runtime_error(prVar8,(string *)&value);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_001244ff;
        }
        bVar4 = std::operator==(vDeploymentParams.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,pVVar12->name);
        if (bVar4) break;
        lVar11 = lVar11 + 1;
        pVVar12 = pVVar12 + 1;
      }
      value._M_dataplus._M_p._0_2_ = (undefined2)lVar11;
      pmVar7 = std::__detail::
               _Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)options,(key_type *)&value);
      pmVar7->min_activation_height = vbparams.min_activation_height;
      *(undefined4 *)&pmVar7->field_0x14 = vbparams._20_4_;
      pmVar7->start_time = vbparams.start_time;
      pmVar7->timeout = vbparams.timeout;
      in_R8 = 0x5e;
      logging_function._M_str = "ReadRegTestArgs";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparams.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<std::__cxx11::string,long,long,int>
                (logging_function,source_file,0x5e,ALL,Info,(ConstevalFormatString<4U>)0x222c64,
                 vDeploymentParams.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&vbparams.start_time,&vbparams.timeout,
                 &vbparams.min_activation_height);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vDeploymentParams);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&deployment_name);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_001244ff:
  __stack_chk_fail();
}

Assistant:

void ReadRegTestArgs(const ArgsManager& args, CChainParams::RegTestOptions& options)
{
    if (auto value = args.GetBoolArg("-fastprune")) options.fastprune = *value;

    for (const std::string& arg : args.GetArgs("-testactivationheight")) {
        const auto found{arg.find('@')};
        if (found == std::string::npos) {
            throw std::runtime_error(strprintf("Invalid format (%s) for -testactivationheight=name@height.", arg));
        }

        const auto value{arg.substr(found + 1)};
        int32_t height;
        if (!ParseInt32(value, &height) || height < 0 || height >= std::numeric_limits<int>::max()) {
            throw std::runtime_error(strprintf("Invalid height value (%s) for -testactivationheight=name@height.", arg));
        }

        const auto deployment_name{arg.substr(0, found)};
        if (const auto buried_deployment = GetBuriedDeployment(deployment_name)) {
            options.activation_heights[*buried_deployment] = height;
        } else {
            throw std::runtime_error(strprintf("Invalid name (%s) for -testactivationheight=name@height.", arg));
        }
    }

    if (!args.IsArgSet("-vbparams")) return;

    for (const std::string& strDeployment : args.GetArgs("-vbparams")) {
        std::vector<std::string> vDeploymentParams = SplitString(strDeployment, ':');
        if (vDeploymentParams.size() < 3 || 4 < vDeploymentParams.size()) {
            throw std::runtime_error("Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]");
        }
        CChainParams::VersionBitsParameters vbparams{};
        if (!ParseInt64(vDeploymentParams[1], &vbparams.start_time)) {
            throw std::runtime_error(strprintf("Invalid nStartTime (%s)", vDeploymentParams[1]));
        }
        if (!ParseInt64(vDeploymentParams[2], &vbparams.timeout)) {
            throw std::runtime_error(strprintf("Invalid nTimeout (%s)", vDeploymentParams[2]));
        }
        if (vDeploymentParams.size() >= 4) {
            if (!ParseInt32(vDeploymentParams[3], &vbparams.min_activation_height)) {
                throw std::runtime_error(strprintf("Invalid min_activation_height (%s)", vDeploymentParams[3]));
            }
        } else {
            vbparams.min_activation_height = 0;
        }
        bool found = false;
        for (int j=0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
            if (vDeploymentParams[0] == VersionBitsDeploymentInfo[j].name) {
                options.version_bits_parameters[Consensus::DeploymentPos(j)] = vbparams;
                found = true;
                LogPrintf("Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n", vDeploymentParams[0], vbparams.start_time, vbparams.timeout, vbparams.min_activation_height);
                break;
            }
        }
        if (!found) {
            throw std::runtime_error(strprintf("Invalid deployment (%s)", vDeploymentParams[0]));
        }
    }
}